

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_cohomology_unit_test.cpp
# Opt level: O0

void __thiscall
persistence_constructor_exception::test_method(persistence_constructor_exception *this)

{
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  size_t sVar4;
  lazy_ostream *plVar5;
  out_of_range *ex;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[52],_const_char_(&)[52]> local_6b8;
  assertion_result local_698;
  basic_cstring<const_char> local_680;
  basic_cstring<const_char> local_670;
  undefined1 local_660 [8];
  Mini_st_persistence pcoh2;
  basic_cstring<const_char> local_498;
  basic_cstring<const_char> local_488;
  basic_cstring<const_char> local_478;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_468;
  assertion_result local_448;
  basic_cstring<const_char> local_430;
  basic_cstring<const_char> local_420;
  undefined1 local_410 [32];
  undefined2 *local_3f0;
  size_t local_3e8;
  basic_cstring<const_char> local_378;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]> local_368;
  assertion_result local_348;
  basic_cstring<const_char> local_330;
  basic_cstring<const_char> local_320;
  undefined1 local_310 [8];
  Mini_st_persistence pcoh;
  basic_cstring<const_char> local_148;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_138;
  assertion_result local_118;
  basic_cstring<const_char> local_100;
  basic_cstring<const_char> local_f0 [2];
  undefined1 local_d0 [32];
  short simplex_0 [8];
  undefined1 local_a0 [8];
  Mini_simplex_tree st;
  persistence_constructor_exception *this_local;
  
  st._128_8_ = this;
  Gudhi::Simplex_tree<MiniSTOptions>::Simplex_tree((Simplex_tree<MiniSTOptions> *)local_a0);
  local_d0._24_8_ = 0x3000200010000;
  simplex_0[0] = 4;
  simplex_0[1] = 5;
  simplex_0[2] = 6;
  simplex_0[3] = 7;
  local_d0._16_8_ = (_Hash_node_base *)0x0;
  Gudhi::Simplex_tree<MiniSTOptions>::insert_simplex_and_subfaces<short[8]>
            ((Simplex_tree<MiniSTOptions> *)local_d0,(short (*) [8])local_a0,
             (Filtration_value *)(local_d0 + 0x18));
  Gudhi::Simplex_tree<MiniSTOptions>::initialize_filtration
            ((Simplex_tree<MiniSTOptions> *)local_a0,false);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_100);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_f0,0xc5,&local_100);
    sVar4 = Gudhi::Simplex_tree<MiniSTOptions>::num_simplices
                      ((Simplex_tree<MiniSTOptions> *)local_a0);
    bVar2 = std::numeric_limits<unsigned_char>::max();
    boost::test_tools::assertion_result::assertion_result(&local_118,sVar4 <= bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,
               "st.num_simplices() <= std::numeric_limits<MiniSTOptions::Simplex_key>::max()",0x4c);
    boost::unit_test::operator<<(&local_138,plVar5,&local_148);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &pcoh.cell_pool_.super_pool<boost::default_user_allocator_malloc_free>.max_size,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion
              (&local_118,&local_138,
               &pcoh.cell_pool_.super_pool<boost::default_user_allocator_malloc_free>.max_size,0xc5,
               1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_138);
    boost::test_tools::assertion_result::~assertion_result(&local_118);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    Gudhi::persistent_cohomology::
    Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>
    ::Persistent_cohomology
              ((Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>
                *)local_310,(Simplex_tree<MiniSTOptions> *)local_a0,false);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_320,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
                 ,0x88);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_330);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_320,199,&local_330);
      boost::test_tools::assertion_result::assertion_result(&local_348,true);
      plVar5 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_368,plVar5,
                 (char (*) [53])"no exceptions thrown by Mini_st_persistence pcoh(st)");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_378,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
                 ,0x88);
      boost::test_tools::tt_detail::report_assertion(&local_348,&local_368,&local_378,199,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl(&local_368);
      boost::test_tools::assertion_result::~assertion_result(&local_348);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    Gudhi::persistent_cohomology::
    Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>
    ::~Persistent_cohomology
              ((Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>
                *)local_310);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  local_410._30_2_ = 8;
  local_3f0 = (undefined2 *)(local_410 + 0x1e);
  local_3e8 = 1;
  local_410._16_8_ = (_Hash_node_base *)0x0;
  Gudhi::Simplex_tree<MiniSTOptions>::insert_simplex<std::initializer_list<short>>
            ((Simplex_tree<MiniSTOptions> *)local_410,(initializer_list<short> *)local_a0,
             (Filtration_value *)&local_3f0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_420,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_430);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_420,0xca,&local_430);
    sVar4 = Gudhi::Simplex_tree<MiniSTOptions>::num_simplices
                      ((Simplex_tree<MiniSTOptions> *)local_a0);
    bVar2 = std::numeric_limits<unsigned_char>::max();
    boost::test_tools::assertion_result::assertion_result(&local_448,bVar2 < sVar4);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_478,
               "st.num_simplices() > std::numeric_limits<MiniSTOptions::Simplex_key>::max()",0x4b);
    boost::unit_test::operator<<(&local_468,plVar5,&local_478);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_488,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_448,&local_468,&local_488,0xca,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_468);
    boost::test_tools::assertion_result::~assertion_result(&local_448);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_498,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               &pcoh2.cell_pool_.super_pool<boost::default_user_allocator_malloc_free>.max_size);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (uVar1,&local_498,0xcc,
               &pcoh2.cell_pool_.super_pool<boost::default_user_allocator_malloc_free>.max_size);
    Gudhi::persistent_cohomology::
    Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>
    ::Persistent_cohomology
              ((Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>
                *)local_660,(Simplex_tree<MiniSTOptions> *)local_a0,false);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_670,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
                 ,0x88);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_680);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_670,0xcc,&local_680);
      boost::test_tools::assertion_result::assertion_result(&local_698,false);
      plVar5 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_6b8,plVar5,
                 (char (*) [52])"exception std::out_of_range expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
                 ,0x88);
      boost::test_tools::tt_detail::report_assertion(&local_698,&local_6b8,&ex,0xcc,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[52],_const_char_(&)[52]>::
      ~lazy_ostream_impl(&local_6b8);
      boost::test_tools::assertion_result::~assertion_result(&local_698);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    Gudhi::persistent_cohomology::
    Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>
    ::~Persistent_cohomology
              ((Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>
                *)local_660);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  Gudhi::Simplex_tree<MiniSTOptions>::~Simplex_tree((Simplex_tree<MiniSTOptions> *)local_a0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( persistence_constructor_exception )
{
  Mini_simplex_tree st;

  // To make number of simplices = 255
  const short simplex_0[] = {0, 1, 2, 3, 4, 5, 6, 7};
  st.insert_simplex_and_subfaces(simplex_0);

  // Sort the simplices in the order of the filtration
  st.initialize_filtration();

  BOOST_CHECK(st.num_simplices() <= std::numeric_limits<MiniSTOptions::Simplex_key>::max());
  // Class for homology computation
  BOOST_CHECK_NO_THROW(Mini_st_persistence pcoh(st));

  st.insert_simplex({8});
  BOOST_CHECK(st.num_simplices() > std::numeric_limits<MiniSTOptions::Simplex_key>::max());
  // Class for homology computation
  BOOST_CHECK_THROW(Mini_st_persistence pcoh2(st), std::out_of_range);

}